

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_gej *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  int iVar1;
  secp256k1_gej *__src;
  secp256k1_fe i;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe z22;
  secp256k1_fe h;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe s2;
  
  secp256k1_gej_verify(a);
  secp256k1_gej_verify(b);
  __src = b;
  if ((a->infinity == 0) && (__src = a, b->infinity == 0)) {
    a_00 = &b->z;
    secp256k1_fe_sqr(&z22,a_00);
    a_01 = &a->z;
    secp256k1_fe_sqr(&z12,a_01);
    secp256k1_fe_mul(&u1,&a->x,&z22);
    secp256k1_fe_mul(&u2,&b->x,&z12);
    secp256k1_fe_mul(&s1,&a->y,&z22);
    secp256k1_fe_mul(&s1,&s1,a_00);
    secp256k1_fe_mul(&s2,&b->y,&z12);
    secp256k1_fe_mul(&s2,&s2,a_01);
    secp256k1_fe_negate_unchecked(&h,&u1,1);
    secp256k1_fe_add(&h,&u2);
    secp256k1_fe_negate_unchecked(&i,&s2,1);
    secp256k1_fe_add(&i,&s1);
    iVar1 = secp256k1_fe_normalizes_to_zero_var(&h);
    if (iVar1 == 0) {
      r->infinity = 0;
      secp256k1_fe_mul(&t,&h,a_00);
      secp256k1_fe_mul(&r->z,a_01,&t);
      secp256k1_fe_sqr(&h2,&h);
      secp256k1_fe_negate_unchecked(&h2,&h2,1);
      secp256k1_fe_mul(&h3,&h2,&h);
      secp256k1_fe_mul(&t,&u1,&h2);
      secp256k1_fe_sqr(&r->x,&i);
      secp256k1_fe_add(&r->x,&h3);
      secp256k1_fe_add(&r->x,&t);
      secp256k1_fe_add(&r->x,&t);
      secp256k1_fe_add(&t,&r->x);
      secp256k1_fe_mul(&r->y,&t,&i);
      secp256k1_fe_mul(&h3,&h3,&s1);
      secp256k1_fe_add(&r->y,&h3);
      secp256k1_gej_verify(r);
    }
    else {
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&i);
      if (iVar1 == 0) {
        secp256k1_gej_set_infinity(r);
      }
      else {
        secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
      }
    }
    return;
  }
  memcpy(r,__src,0x98);
  return;
}

Assistant:

static void secp256k1_gej_add_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_gej *b, secp256k1_fe *rzr) {
    /* 12 mul, 4 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z22, z12, u1, u2, s1, s2, h, i, h2, h3, t;

    secp256k1_gej_verify(a);
    secp256k1_gej_verify(b);
    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        *r = *b;
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z22, &b->z);
    secp256k1_fe_sqr(&z12, &a->z);
    secp256k1_fe_mul(&u1, &a->x, &z22);
    secp256k1_fe_mul(&u2, &b->x, &z12);
    secp256k1_fe_mul(&s1, &a->y, &z22); secp256k1_fe_mul(&s1, &s1, &b->z);
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, 1); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&t, &h, &b->z);
    if (rzr != NULL) {
        *rzr = t;
    }
    secp256k1_fe_mul(&r->z, &a->z, &t);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);
    secp256k1_gej_verify(r);
}